

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::mult(Matrix *this,Matrix *m)

{
  int row;
  int col;
  uint uVar1;
  double **ppdVar2;
  Matrix *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int k;
  ulong uVar9;
  allocator local_49;
  string local_48;
  
  this_00 = (Matrix *)operator_new(0x30);
  row = this->rowNo;
  col = m->colNo;
  std::__cxx11::string::string((string *)&local_48,"result of multiply of two matrix:",&local_49);
  Matrix(this_00,row,col,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  uVar1 = this->colNo;
  uVar4 = 0;
  if (uVar1 == m->rowNo) {
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    uVar5 = (ulong)(uint)this->rowNo;
    if (this->rowNo < 1) {
      uVar5 = uVar4;
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      uVar7 = (ulong)(uint)m->colNo;
      if (m->colNo < 1) {
        uVar7 = uVar4;
      }
      for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
        ppdVar2 = this->array;
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          this_00->array[uVar6][uVar8] =
               ppdVar2[uVar6][uVar9] * m->array[uVar9][uVar8] + this_00->array[uVar6][uVar8];
        }
      }
    }
  }
  else {
    this_00 = (Matrix *)0x0;
  }
  return this_00;
}

Assistant:

Matrix* Matrix::mult(Matrix *m)
{

    Matrix *n = new Matrix(rowNo, m->colNo, "result of multiply of two matrix:");
    if (colNo == m->rowNo)
    {

        for (int i = 0; i < rowNo; i++)
        {
            for (int j = 0; j < m->colNo; j++)
            {
                for (int k = 0; k < colNo; k++)
                {
                    n->array[i][j]  = array[i][k] * m->array[k][j] + n->array[i][j];
                }
            }
        }

    }

    else
    {
        return 0;

    }
    return n;
}